

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

string * relive::stripTypeName(string *__return_storage_ptr__,string *classname)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pcVar3;
  size_type sVar4;
  char *__s;
  ulong uVar5;
  undefined8 uVar6;
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __s = (char *)__cxa_demangle((classname->_M_dataplus)._M_p,0,0);
  pcVar2 = (char *)__return_storage_ptr__->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar2,(ulong)__s);
  if (__s != (char *)0x0) {
    free(__s);
  }
  pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar4 = __return_storage_ptr__->_M_string_length;
  if (pcVar3[sVar4 - 1] == '*') {
    if (sVar4 == 0) {
      uVar6 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase");
      __cxa_free_exception(__s);
      pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar1) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar6);
    }
    __return_storage_ptr__->_M_string_length = sVar4 - 1;
    pcVar3[sVar4 - 1] = '\0';
  }
  uVar5 = 0;
  while (uVar5 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x1d26d6,uVar5),
        uVar5 != 0xffffffffffffffff) {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar5 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string stripTypeName(const std::string& classname)
{
#ifdef _WIN32
    std::string::size_type pos1 = classname.find_first_of(" ");
    std::string::size_type pos3 = classname.find_last_of(">");
    if(pos3 != std::string::npos)
    {
        return classname.substr(pos1+1, (pos3 - pos1));
    }
    std::string::size_type pos2 = classname.find_last_of(" ");
    return classname.substr(pos1+1, (pos2 - pos1)-1);
#else
    return demangle(classname);
#endif
}